

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O2

BasicValue *
cvm::Native::ToString
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  string local_38;
  shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> local_18;
  
  if ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl._M_node.
      _M_size == 1) {
    local_18.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_18.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BasicValue::toString_abi_cxx11_
              (&local_38,
               (BasicValue *)
               ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
                _M_node.super__List_node_base._M_next + 1),&local_18);
    BasicValue::BasicValue(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_18.
                super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    BasicValue::BasicValue(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Native::ToString(std::list<BasicValue> &Args) {
  if (Args.size() != 1)
    return std::string();
  return Args.front().toString();
}